

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_5e4c5e::ThrowExpr::printLeft(ThrowExpr *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,6);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"throw ",6);
  S->CurrentPosition = S->CurrentPosition + 6;
  pNVar1 = this->Op;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "throw ";
    Op->print(S);
  }